

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O3

Dist * Omega_h::copies_to_linear_owners
                 (Dist *__return_storage_ptr__,CommPtr *comm,Read<long> *globals)

{
  Alloc *pAVar1;
  int *piVar2;
  Comm *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  Dist *this_01;
  I32 IVar5;
  I32 IVar6;
  long *plVar7;
  ulong total;
  void **ppvVar8;
  void *pvVar9;
  ScopedTimer omega_h_scoped_function_timer;
  Remotes copies2lins_map;
  string __str;
  ScopedTimer local_131;
  undefined1 local_130 [24];
  void *pvStack_118;
  Read<long> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  void *local_f8;
  long lStack_f0;
  Alloc *local_e8;
  long local_e0;
  undefined1 local_d8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  CommPtr local_b8;
  CommPtr local_a8;
  Remotes local_98;
  Dist *local_78;
  Read<long> local_70;
  Read<long> local_60;
  long *local_50 [2];
  long local_40 [2];
  
  local_110 = globals;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_linpart.cpp"
             ,"");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  ppvVar8 = (void **)(plVar7 + 2);
  if ((void **)*plVar7 == ppvVar8) {
    local_f8 = *ppvVar8;
    lStack_f0 = plVar7[3];
    local_108._M_allocated_capacity = (size_type)&local_f8;
  }
  else {
    local_f8 = *ppvVar8;
    local_108._M_allocated_capacity = (size_type)(void **)*plVar7;
  }
  local_108._8_8_ = plVar7[1];
  *plVar7 = (long)ppvVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_e8 = (Alloc *)local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,'\x02');
  *(undefined2 *)&local_e8->size = 0x3435;
  pvVar9 = (void *)0xf;
  if ((void **)local_108._M_allocated_capacity != &local_f8) {
    pvVar9 = local_f8;
  }
  if (pvVar9 < (void *)(local_e0 + local_108._8_8_)) {
    pvVar9 = (void *)0xf;
    if (local_e8 != (Alloc *)local_d8) {
      pvVar9 = (void *)local_d8._0_8_;
    }
    if ((void *)(local_e0 + local_108._8_8_) <= pvVar9) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_e8,0,(char *)0x0,local_108._M_allocated_capacity);
      goto LAB_002f59ad;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append(local_108._M_local_buf,(ulong)local_e8);
LAB_002f59ad:
  local_130._0_8_ = local_130 + 0x10;
  pAVar1 = (Alloc *)(plVar7 + 2);
  if ((Alloc *)*plVar7 == pAVar1) {
    local_130._16_8_ = pAVar1->size;
    pvStack_118 = (void *)plVar7[3];
  }
  else {
    local_130._16_8_ = pAVar1->size;
    local_130._0_8_ = (Alloc *)*plVar7;
  }
  local_130._8_8_ = plVar7[1];
  *plVar7 = (long)pAVar1;
  plVar7[1] = 0;
  *(undefined1 *)&pAVar1->size = 0;
  begin_code("copies_to_linear_owners",(char *)local_130._0_8_);
  if ((Alloc *)local_130._0_8_ != (Alloc *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_,(ulong)((long)(size_t *)local_130._16_8_ + 1));
  }
  if (local_e8 != (Alloc *)local_d8) {
    operator_delete(local_e8,local_d8._0_8_ + 1);
  }
  if ((void **)local_108._M_allocated_capacity != &local_f8) {
    operator_delete((void *)local_108._M_allocated_capacity,(long)local_f8 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.alloc = (local_110->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar1 = local_60.write_.shared_alloc_.alloc;
  local_60.write_.shared_alloc_.direct_ptr = (local_110->write_).shared_alloc_.direct_ptr;
  total = find_total_globals(&local_a8,&local_60);
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    piVar2 = &pAVar1->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  if (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_78 = __return_storage_ptr__;
  IVar5 = Comm::size(this);
  IVar6 = Comm::rank(this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = total;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_70.write_.shared_alloc_.alloc = (local_110->write_).shared_alloc_.alloc;
  if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
      local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70.write_.shared_alloc_.alloc =
           (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_70.write_.shared_alloc_.alloc)->use_count =
           (local_70.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar1 = local_70.write_.shared_alloc_.alloc;
  local_70.write_.shared_alloc_.direct_ptr = (local_110->write_).shared_alloc_.direct_ptr;
  globals_to_linear_owners((Remotes *)local_130,&local_b8,&local_70,total);
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    piVar2 = &pAVar1->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  if (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this_01 = local_78;
  local_d8._16_8_ = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c0 = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_c0->_M_use_count = local_c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_c0->_M_use_count = local_c0->_M_use_count + 1;
    }
  }
  local_98.ranks.write_.shared_alloc_.alloc = (Alloc *)local_130._0_8_;
  if ((local_130._0_8_ & 7) == 0 && (Alloc *)local_130._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.ranks.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_130._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_130._0_8_ + 0x30) = *(int *)(local_130._0_8_ + 0x30) + 1;
    }
  }
  local_98.ranks.write_.shared_alloc_.direct_ptr = (void *)local_130._8_8_;
  local_98.idxs.write_.shared_alloc_.alloc = (Alloc *)local_130._16_8_;
  if ((local_130._16_8_ & 7) == 0 && (Alloc *)local_130._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.idxs.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_130._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_130._16_8_ + 0x30) = *(int *)(local_130._16_8_ + 0x30) + 1;
    }
  }
  local_98.idxs.write_.shared_alloc_.direct_ptr = pvStack_118;
  Dist::Dist(this_01,(CommPtr *)(local_d8 + 0x10),&local_98,
             (uint)(IVar6 < SUB164(auVar3 % SEXT816((long)IVar5),0)) +
             SUB164(auVar3 / SEXT816((long)IVar5),0));
  pAVar1 = local_98.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_98.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_98.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar1,0x48);
    }
  }
  pAVar1 = local_98.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_98.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_98.ranks.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar1);
      operator_delete(pAVar1,0x48);
    }
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  uVar4 = local_130._16_8_;
  if ((local_130._16_8_ & 7) == 0 && (Alloc *)local_130._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_130._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_130._16_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  uVar4 = local_130._0_8_;
  if ((local_130._0_8_ & 7) == 0 && (Alloc *)local_130._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_130._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_130._0_8_);
      operator_delete((void *)uVar4,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_131);
  return this_01;
}

Assistant:

Dist copies_to_linear_owners(CommPtr comm, Read<GO> globals) {
  OMEGA_H_TIME_FUNCTION;
  auto const total = find_total_globals(comm, globals);
  auto const nlins = linear_partition_size(comm, total);
  auto const copies2lins_map = globals_to_linear_owners(comm, globals, total);
  auto const copies2lins_dist = Dist(comm, copies2lins_map, nlins);
  return copies2lins_dist;
}